

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_digest.hpp
# Opt level: O3

Value __thiscall duckdb_tdigest::TDigest::quantileProcessed(TDigest *this,Value q)

{
  pointer pCVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar9 = NAN;
  if ((0.0 <= q) && (q <= 1.0)) {
    pCVar1 = (this->processed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(this->processed_).
                  super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 4;
    if (lVar5 != 0) {
      if (lVar5 == 1) {
        dVar9 = pCVar1->mean_;
      }
      else {
        dVar8 = q * this->processedWeight_;
        if (dVar8 <= pCVar1->weight_ * 0.5) {
          dVar9 = (pCVar1->mean_ - this->min_) * ((dVar8 + dVar8) / pCVar1->weight_) + this->min_;
        }
        else {
          pdVar2 = (this->cumulative_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3 = (this->cumulative_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pdVar6 = pdVar2;
          uVar7 = (long)pdVar3 - (long)pdVar2 >> 3;
          while (uVar4 = uVar7, 0 < (long)uVar4) {
            uVar7 = uVar4 >> 1;
            if (pdVar6[uVar7] <= dVar8 && dVar8 != pdVar6[uVar7]) {
              pdVar6 = pdVar6 + uVar7 + 1;
              uVar7 = ~uVar7 + uVar4;
            }
          }
          if (pdVar6 + 1 == pdVar3) {
            dVar11 = pCVar1[lVar5 + -1].mean_;
            dVar12 = pCVar1[lVar5 + -1].weight_ * 0.5;
            dVar10 = (dVar8 - this->processedWeight_) - dVar12;
            dVar12 = dVar12 - dVar10;
            dVar8 = this->max_;
            if (dVar11 <= dVar8) {
              dVar13 = dVar11 * dVar10 + dVar8 * dVar12;
              dVar9 = dVar8;
            }
            else {
              dVar13 = dVar8 * dVar12 + dVar11 * dVar10;
              dVar9 = dVar11;
              dVar11 = dVar8;
            }
            dVar13 = dVar13 / (dVar10 + dVar12);
            if (dVar13 <= dVar9) {
              dVar9 = dVar13;
            }
            if (dVar9 <= dVar11) {
              dVar9 = dVar11;
            }
          }
          else {
            dVar10 = dVar8 - pdVar6[-1];
            dVar8 = *pdVar6 - dVar8;
            dVar11 = *(double *)((long)pCVar1 + ((long)pdVar6 - (long)pdVar2) * 2 + -0x10);
            dVar9 = *(double *)((long)pCVar1 + ((long)pdVar6 - (long)pdVar2) * 2);
            if (dVar11 <= dVar9) {
              dVar13 = dVar11 * dVar8 + dVar10 * dVar9;
              dVar12 = dVar11;
            }
            else {
              dVar13 = dVar9 * dVar10 + dVar11 * dVar8;
              dVar12 = dVar9;
              dVar9 = dVar11;
            }
            dVar13 = dVar13 / (dVar10 + dVar8);
            if (dVar13 <= dVar9) {
              dVar9 = dVar13;
            }
            if (dVar9 <= dVar12) {
              dVar9 = dVar12;
            }
          }
        }
      }
    }
  }
  return dVar9;
}

Assistant:

Value quantileProcessed(Value q) const {
		if (q < 0 || q > 1) {
			return NAN;
		}

		if (processed_.size() == 0) {
			// no sorted means no data, no way to get a quantile
			return NAN;
		} else if (processed_.size() == 1) {
			// with one data point, all quantiles lead to Rome

			return mean(0);
		}

		// we know that there are at least two sorted now
		auto n = processed_.size();

		// if values were stored in a sorted array, index would be the offset we are Weighterested in
		const auto index = q * processedWeight_;

		// at the boundaries, we return min_ or max_
		if (index <= weight(0) / 2.0) {
			return min_ + 2.0 * index / weight(0) * (mean(0) - min_);
		}

		auto iter = std::lower_bound(cumulative_.cbegin(), cumulative_.cend(), index);

		if (iter + 1 != cumulative_.cend()) {
			auto i = size_t(std::distance(cumulative_.cbegin(), iter));
			auto z1 = index - *(iter - 1);
			auto z2 = *(iter)-index;
			// LOG(INFO) << "z2 " << z2 << " index " << index << " z1 " << z1;
			return weightedAverage(mean(i - 1), z2, mean(i), z1);
		}
		auto z1 = index - processedWeight_ - weight(n - 1) / 2.0;
		auto z2 = weight(n - 1) / 2 - z1;
		return weightedAverage(mean(n - 1), z1, max_, z2);
	}